

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_reg_write(uc_engine *uc,int regid,void *value)

{
  uc_err uVar1;
  size_t sStack_38;
  uc_err err;
  size_t size;
  int setpc;
  int __init_ret;
  void *value_local;
  uc_engine *puStack_18;
  int regid_local;
  uc_engine *uc_local;
  
  _setpc = value;
  value_local._4_4_ = regid;
  puStack_18 = uc;
  if (((uc->init_done ^ 0xffU) & 1) != 0) {
    uVar1 = uc_init_engine(uc);
    if (uVar1 != UC_ERR_OK) {
      return uVar1;
    }
    size._4_4_ = 0;
  }
  size._0_4_ = 0;
  sStack_38 = 0xffffffffffffffff;
  uc_local._4_4_ =
       (*puStack_18->reg_write)
                 (puStack_18->cpu->env_ptr,puStack_18->mode,value_local._4_4_,_setpc,
                  &stack0xffffffffffffffc8,(int *)&size);
  if (uc_local._4_4_ == UC_ERR_OK) {
    if ((int)size != 0) {
      puStack_18->quit_request = true;
      break_translation_loop(puStack_18);
    }
    uc_local._4_4_ = UC_ERR_OK;
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_reg_write(uc_engine *uc, int regid, const void *value)
{
    UC_INIT(uc);
    int setpc = 0;
    size_t size = (size_t)-1;
    uc_err err =
        uc->reg_write(uc->cpu->env_ptr, uc->mode, regid, value, &size, &setpc);
    if (err) {
        return err;
    }
    if (setpc) {
        // force to quit execution and flush TB
        uc->quit_request = true;
        break_translation_loop(uc);
    }

    return UC_ERR_OK;
}